

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O3

void address_space_destroy_mips(AddressSpace *as)

{
  MemoryRegion *mr;
  QTailQLink *pQVar1;
  anon_union_16_2_aaf24f3d_for_address_spaces_link *paVar2;
  
  mr = (MemoryRegion *)as->root;
  as->root = (MemoryRegion_conflict *)0x0;
  memory_region_transaction_commit_mips(mr);
  pQVar1 = (as->address_spaces_link).tqe_circ.tql_prev;
  if ((as->address_spaces_link).tqe_next == (AddressSpace *)0x0) {
    paVar2 = (anon_union_16_2_aaf24f3d_for_address_spaces_link *)&as->uc->address_spaces;
  }
  else {
    paVar2 = &((as->address_spaces_link).tqe_next)->address_spaces_link;
  }
  (paVar2->tqe_circ).tql_prev = pQVar1;
  pQVar1->tql_next = (as->address_spaces_link).tqe_next;
  (as->address_spaces_link).tqe_next = (AddressSpace *)0x0;
  (as->address_spaces_link).tqe_circ.tql_prev = (QTailQLink *)0x0;
  as->root = (MemoryRegion_conflict *)mr;
  flatview_unref_mips(as->current_map);
  return;
}

Assistant:

void address_space_destroy(AddressSpace *as)
{
    MemoryRegion *root = as->root;

    /* Flush out anything from MemoryListeners listening in on this */
    memory_region_transaction_begin();
    as->root = NULL;
    memory_region_transaction_commit(root);
    QTAILQ_REMOVE(&as->uc->address_spaces, as, address_spaces_link);

    /* At this point, as->dispatch and as->current_map are dummy
     * entries that the guest should never use.  Wait for the old
     * values to expire before freeing the data.
     */
    as->root = root;
    flatview_unref(as->current_map);
}